

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void create_binary_instruction
               (Proc *proc,opcode targetop,Pseudo *operand1,Pseudo *operand2,Pseudo *target,
               uint line_number)

{
  Instruction *insn;
  Pseudo *pseudo;
  Pseudo *pseudo_00;
  
  insn = allocate_instruction(proc,targetop,line_number);
  pseudo = add_instruction_operand(proc,insn,operand1);
  pseudo_00 = add_instruction_operand(proc,insn,operand2);
  add_instruction_target(proc,insn,target);
  add_instruction(proc,insn);
  if (pseudo != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo,false);
  }
  if (pseudo_00 != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo_00,false);
    return;
  }
  return;
}

Assistant:

static void create_binary_instruction(Proc *proc, enum opcode targetop, Pseudo *operand1,
				      Pseudo *operand2, Pseudo *target, unsigned line_number)
{
	Instruction *insn = allocate_instruction(proc, targetop, line_number);
	Pseudo *tofree1 = add_instruction_operand(proc, insn, operand1);
	Pseudo *tofree2 = add_instruction_operand(proc, insn, operand2);
	add_instruction_target(proc, insn, target);
	add_instruction(proc, insn);
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
}